

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_ParseCoinbaseScriptsigTest_Test::TestBody(Script_ParseCoinbaseScriptsigTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_258;
  Message local_250;
  ByteData local_248;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  Message local_1b0;
  ByteData local_1a8;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  ByteData local_150;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  size_type local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  Message local_b8;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Script obj;
  allocator local_31;
  undefined1 local_30 [8];
  string script;
  Script_ParseCoinbaseScriptsigTest_Test *this_local;
  
  script.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "03632b1e045352b260425443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Script::Script((Script *)&gtest_ar.message_,(string *)local_30);
  cfd::core::Script::GetHex_abi_cxx11_(&local_b0,(Script *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_90,"script","obj.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_b0
            );
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &list.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0x21b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &list.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &list.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  cfd::core::Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &gtest_ar_1.message_,(Script *)&gtest_ar.message_);
  local_ec = 3;
  local_f8 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                       ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_e8,"3","list.size()",&local_ec,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0x21d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  sVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     &gtest_ar_1.message_);
  if (sVar3 == 3) {
    pvVar4 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&gtest_ar_1.message_,0);
    cfd::core::ScriptElement::GetData(&local_150,pvVar4);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_138,&local_150);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((EqHelper<false> *)local_118,"\"03632b1e\"","list[0].GetData().GetHex()",
               (char (*) [9])"03632b1e",&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cfd::core::ByteData::~ByteData(&local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x21f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    pvVar4 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&gtest_ar_1.message_,1);
    cfd::core::ScriptElement::GetData(&local_1a8,pvVar4);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_190,&local_1a8);
    testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
              ((EqHelper<false> *)local_170,"\"045352b260\"","list[1].GetData().GetHex()",
               (char (*) [11])"045352b260",&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    cfd::core::ByteData::~ByteData(&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x220,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    pvVar4 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&gtest_ar_1.message_,2);
    local_1c9 = cfd::core::ScriptElement::IsBinary(pvVar4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_4.message_,(internal *)local_1c8,
                 (AssertionResult *)"list[2].IsBinary()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x221,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    pvVar4 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&gtest_ar_1.message_,2);
    cfd::core::ScriptElement::GetBinaryData(&local_248,pvVar4);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_230,&local_248);
    testing::internal::EqHelper<false>::Compare<char[125],std::__cxx11::string>
              ((EqHelper<false> *)local_210,
               "\"5443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000\""
               ,"list[2].GetBinaryData().GetHex()",(char (*) [125])0x69c58c,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    cfd::core::ByteData::~ByteData(&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x225,pcVar2);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  }
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &gtest_ar_1.message_);
  cfd::core::Script::~Script((Script *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Script, ParseCoinbaseScriptsigTest) {
  const std::string script = "03632b1e045352b260425443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000";
  Script obj(script);
  EXPECT_EQ(script, obj.GetHex());
  auto list = obj.GetElementList();
  EXPECT_EQ(3, list.size());
  if (list.size() == 3) {
    EXPECT_EQ("03632b1e", list[0].GetData().GetHex());
    EXPECT_EQ("045352b260", list[1].GetData().GetHex());
    EXPECT_TRUE(list[2].IsBinary());
    // buffer size is low from length.
    EXPECT_EQ(
      "5443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000",
      list[2].GetBinaryData().GetHex());
  }
}